

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::mergeRuleStatusVals(RBBITableBuilder *this)

{
  UVector *this_00;
  UVector *pUVar1;
  int32_t iVar2;
  int iVar3;
  int32_t iVar4;
  void *pvVar5;
  int local_30;
  int32_t nextTagGroupStart;
  int32_t thisTagGroupStart;
  UVector *thisStatesTagValues;
  RBBIStateDescriptor *sd;
  int n;
  int i;
  RBBITableBuilder *this_local;
  
  iVar2 = UVector::size(this->fRB->fRuleStatusVals);
  if (iVar2 == 0) {
    UVector::addElement(this->fRB->fRuleStatusVals,1,this->fStatus);
    UVector::addElement(this->fRB->fRuleStatusVals,0,this->fStatus);
  }
  sd._0_4_ = 0;
  do {
    iVar2 = UVector::size(this->fDStates);
    if (iVar2 <= (int)sd) {
      return;
    }
    pvVar5 = UVector::elementAt(this->fDStates,(int)sd);
    this_00 = *(UVector **)((long)pvVar5 + 0x10);
    if (this_00 == (UVector *)0x0) {
      *(undefined4 *)((long)pvVar5 + 0x18) = 0;
    }
    else {
      *(undefined4 *)((long)pvVar5 + 0x18) = 0xffffffff;
      local_30 = 0;
      iVar3 = local_30;
      do {
        do {
          local_30 = iVar3;
          iVar2 = UVector::size(this->fRB->fRuleStatusVals);
          if (iVar2 <= local_30) goto LAB_0035ee9b;
          iVar2 = UVector::elementAti(this->fRB->fRuleStatusVals,local_30);
          iVar3 = iVar2 + 1 + local_30;
          iVar2 = UVector::size(this_00);
          iVar4 = UVector::elementAti(this->fRB->fRuleStatusVals,local_30);
        } while (iVar2 != iVar4);
        for (sd._4_4_ = 0; iVar2 = UVector::size(this_00), sd._4_4_ < iVar2; sd._4_4_ = sd._4_4_ + 1
            ) {
          iVar2 = UVector::elementAti(this_00,sd._4_4_);
          iVar4 = UVector::elementAti(this->fRB->fRuleStatusVals,local_30 + 1 + sd._4_4_);
          if (iVar2 != iVar4) break;
        }
        iVar2 = UVector::size(this_00);
      } while (sd._4_4_ != iVar2);
      *(int *)((long)pvVar5 + 0x18) = local_30;
LAB_0035ee9b:
      if (*(int *)((long)pvVar5 + 0x18) == -1) {
        iVar2 = UVector::size(this->fRB->fRuleStatusVals);
        *(int32_t *)((long)pvVar5 + 0x18) = iVar2;
        pUVar1 = this->fRB->fRuleStatusVals;
        iVar2 = UVector::size(this_00);
        UVector::addElement(pUVar1,iVar2,this->fStatus);
        for (sd._4_4_ = 0; iVar2 = UVector::size(this_00), sd._4_4_ < iVar2; sd._4_4_ = sd._4_4_ + 1
            ) {
          pUVar1 = this->fRB->fRuleStatusVals;
          iVar2 = UVector::elementAti(this_00,sd._4_4_);
          UVector::addElement(pUVar1,iVar2,this->fStatus);
        }
      }
    }
    sd._0_4_ = (int)sd + 1;
  } while( true );
}

Assistant:

void  RBBITableBuilder::mergeRuleStatusVals() {
    //
    //  The basic outline of what happens here is this...
    //
    //    for each state in this state table
    //       if the status tag list for this state is in the global statuses list
    //           record where and
    //           continue with the next state
    //       else
    //           add the tag list for this state to the global list.
    //
    int i;
    int n;

    // Pre-set a single tag of {0} into the table.
    //   We will need this as a default, for rule sets with no explicit tagging.
    if (fRB->fRuleStatusVals->size() == 0) {
        fRB->fRuleStatusVals->addElement(1, *fStatus);  // Num of statuses in group
        fRB->fRuleStatusVals->addElement((int32_t)0, *fStatus);  //   and our single status of zero
    }

    //    For each state
    for (n=0; n<fDStates->size(); n++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
        UVector *thisStatesTagValues = sd->fTagVals;
        if (thisStatesTagValues == NULL) {
            // No tag values are explicitly associated with this state.
            //   Set the default tag value.
            sd->fTagsIdx = 0;
            continue;
        }

        // There are tag(s) associated with this state.
        //   fTagsIdx will be the index into the global tag list for this state's tag values.
        //   Initial value of -1 flags that we haven't got it set yet.
        sd->fTagsIdx = -1;
        int32_t  thisTagGroupStart = 0;   // indexes into the global rule status vals list
        int32_t  nextTagGroupStart = 0;

        // Loop runs once per group of tags in the global list
        while (nextTagGroupStart < fRB->fRuleStatusVals->size()) {
            thisTagGroupStart = nextTagGroupStart;
            nextTagGroupStart += fRB->fRuleStatusVals->elementAti(thisTagGroupStart) + 1;
            if (thisStatesTagValues->size() != fRB->fRuleStatusVals->elementAti(thisTagGroupStart)) {
                // The number of tags for this state is different from
                //    the number of tags in this group from the global list.
                //    Continue with the next group from the global list.
                continue;
            }
            // The lengths match, go ahead and compare the actual tag values
            //    between this state and the group from the global list.
            for (i=0; i<thisStatesTagValues->size(); i++) {
                if (thisStatesTagValues->elementAti(i) !=
                    fRB->fRuleStatusVals->elementAti(thisTagGroupStart + 1 + i) ) {
                    // Mismatch.
                    break;
                }
            }

            if (i == thisStatesTagValues->size()) {
                // We found a set of tag values in the global list that match
                //   those for this state.  Use them.
                sd->fTagsIdx = thisTagGroupStart;
                break;
            }
        }

        if (sd->fTagsIdx == -1) {
            // No suitable entry in the global tag list already.  Add one
            sd->fTagsIdx = fRB->fRuleStatusVals->size();
            fRB->fRuleStatusVals->addElement(thisStatesTagValues->size(), *fStatus);
            for (i=0; i<thisStatesTagValues->size(); i++) {
                fRB->fRuleStatusVals->addElement(thisStatesTagValues->elementAti(i), *fStatus);
            }
        }
    }
}